

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMem.cpp
# Opt level: O0

void __thiscall asl::SharedMem::~SharedMem(SharedMem *this)

{
  char *__name;
  SharedMem *this_local;
  
  if (this->_ptr != (byte *)0x0) {
    munmap(this->_ptr,(long)this->_size);
    __name = asl::String::operator_cast_to_char_(&this->_name);
    shm_unlink(__name);
  }
  asl::String::~String(&this->_name);
  return;
}

Assistant:

SharedMem::~SharedMem()
{
#ifdef _WIN32
	UnmapViewOfFile(_ptr);
	CloseHandle(_handle);
#elif !defined(__ANDROID__)
	if(_ptr)
	{
		munmap(_ptr, (size_t)_size);
		shm_unlink(_name);
	}
#endif
}